

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

size_t roaring_bitmap_frozen_size_in_bytes(roaring_bitmap_t *rb)

{
  uint8_t uVar1;
  array_container_t *ac;
  run_container_t *rc;
  int32_t i;
  size_t num_bytes;
  roaring_array_t *ra;
  roaring_bitmap_t *rb_local;
  
  num_bytes = 0;
  for (i = 0; i < (rb->high_low_container).size; i = i + 1) {
    uVar1 = (rb->high_low_container).typecodes[i];
    if (uVar1 == '\x01') {
      num_bytes = num_bytes + 0x2000;
    }
    else if (uVar1 == '\x02') {
      num_bytes = (long)*(rb->high_low_container).containers[i] * 2 + num_bytes;
    }
    else {
      num_bytes = (long)*(rb->high_low_container).containers[i] * 4 + num_bytes;
    }
  }
  return (long)((rb->high_low_container).size * 5) + num_bytes + 4;
}

Assistant:

size_t roaring_bitmap_frozen_size_in_bytes(const roaring_bitmap_t *rb) {
    const roaring_array_t *ra = &rb->high_low_container;
    size_t num_bytes = 0;
    for (int32_t i = 0; i < ra->size; i++) {
        switch (ra->typecodes[i]) {
            case BITSET_CONTAINER_TYPE: {
                num_bytes += BITSET_CONTAINER_SIZE_IN_WORDS * sizeof(uint64_t);
                break;
            }
            case RUN_CONTAINER_TYPE: {
                const run_container_t *rc = const_CAST_run(ra->containers[i]);
                num_bytes += rc->n_runs * sizeof(rle16_t);
                break;
            }
            case ARRAY_CONTAINER_TYPE: {
                const array_container_t *ac =
                    const_CAST_array(ra->containers[i]);
                num_bytes += ac->cardinality * sizeof(uint16_t);
                break;
            }
            default:
                roaring_unreachable;
        }
    }
    num_bytes += (2 + 2 + 1) * ra->size;  // keys, counts, typecodes
    num_bytes += 4;                       // header
    return num_bytes;
}